

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

float Assimp::FBX::ParseTokenAsFloat(Token *t,char **err_out)

{
  bool bVar1;
  TokenType TVar2;
  char *pcVar3;
  char *pcVar4;
  unsigned_long *puVar5;
  double dVar6;
  unsigned_long local_58;
  unsigned_long local_50;
  size_t length;
  char temp [32];
  char *data;
  char **err_out_local;
  Token *t_local;
  
  *err_out = (char *)0x0;
  TVar2 = Token::Type(t);
  if (TVar2 == TokenType_DATA) {
    bVar1 = Token::IsBinary(t);
    if (bVar1) {
      temp._24_8_ = Token::begin(t);
      if ((*(char *)temp._24_8_ == 'F') || (*(char *)temp._24_8_ == 'D')) {
        if (*(char *)temp._24_8_ == 'F') {
          pcVar3 = (char *)(temp._24_8_ + 1);
          pcVar4 = Token::end(t);
          t_local._4_4_ = anon_unknown.dwarf_1924db::SafeParse<float>(pcVar3,pcVar4);
        }
        else {
          pcVar3 = (char *)(temp._24_8_ + 1);
          pcVar4 = Token::end(t);
          dVar6 = anon_unknown.dwarf_1924db::SafeParse<double>(pcVar3,pcVar4);
          t_local._4_4_ = (ai_real)dVar6;
        }
      }
      else {
        *err_out = "failed to parse F(loat) or D(ouble), unexpected data type (binary)";
        t_local._4_4_ = 0.0;
      }
    }
    else {
      pcVar3 = Token::end(t);
      pcVar4 = Token::begin(t);
      local_50 = (long)pcVar3 - (long)pcVar4;
      pcVar3 = Token::begin(t);
      pcVar4 = Token::end(t);
      std::copy<char_const*,char*>(pcVar3,pcVar4,(char *)&length);
      local_58 = 0x1f;
      puVar5 = std::min<unsigned_long>(&local_58,&local_50);
      temp[*puVar5 - 8] = '\0';
      t_local._4_4_ = fast_atof((char *)&length);
    }
  }
  else {
    *err_out = "expected TOK_DATA token";
    t_local._4_4_ = 0.0;
  }
  return t_local._4_4_;
}

Assistant:

float ParseTokenAsFloat(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return 0.0f;
    }

    if(t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'F' && data[0] != 'D') {
            err_out = "failed to parse F(loat) or D(ouble), unexpected data type (binary)";
            return 0.0f;
        }

        if (data[0] == 'F') {
            return SafeParse<float>(data+1, t.end());
        }
        else {
            return static_cast<float>( SafeParse<double>(data+1, t.end()) );
        }
    }

    // need to copy the input string to a temporary buffer
    // first - next in the fbx token stream comes ',',
    // which fast_atof could interpret as decimal point.
#define MAX_FLOAT_LENGTH 31
    char temp[MAX_FLOAT_LENGTH + 1];
    const size_t length = static_cast<size_t>(t.end()-t.begin());
    std::copy(t.begin(),t.end(),temp);
    temp[std::min(static_cast<size_t>(MAX_FLOAT_LENGTH),length)] = '\0';

    return fast_atof(temp);
}